

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# no_field_presence_map_test.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::
NoFieldPresenceTest_TestNonZeroImplicitSubMessageMapEntriesHavePresence_Test::TestBody
          (NoFieldPresenceTest_TestNonZeroImplicitSubMessageMapEntriesHavePresence_Test *this)

{
  bool bVar1;
  Descriptor *this_00;
  Map<int,_proto2_nofieldpresence_unittest::ForeignMessage> *this_01;
  ForeignMessage *this_02;
  char *pcVar2;
  AssertHelper local_180;
  Message local_178;
  char local_169;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_1;
  Message local_150;
  char local_141;
  undefined1 local_140 [8];
  AssertionResult gtest_ar;
  Message *msg_map_entry;
  string_view local_120;
  FieldDescriptor *local_110;
  FieldDescriptor *field_map_int32_foreign_message;
  Descriptor *desc;
  Reflection *local_f0;
  Reflection *r;
  TestAllMapTypes message;
  NoFieldPresenceTest_TestNonZeroImplicitSubMessageMapEntriesHavePresence_Test *this_local;
  
  message.field_0._192_8_ = this;
  proto2_nofieldpresence_unittest::TestAllMapTypes::TestAllMapTypes((TestAllMapTypes *)&r);
  local_f0 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetReflection();
  this_00 = proto2_nofieldpresence_unittest::TestAllMapTypes::GetDescriptor();
  field_map_int32_foreign_message = (FieldDescriptor *)this_00;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_120,"map_int32_foreign_message");
  local_110 = Descriptor::FindFieldByName(this_00,local_120);
  this_01 = proto2_nofieldpresence_unittest::TestAllMapTypes::mutable_map_int32_foreign_message
                      ((TestAllMapTypes *)&r);
  msg_map_entry._4_4_ = 0x7b;
  this_02 = Map<int,_proto2_nofieldpresence_unittest::ForeignMessage>::operator[]<int>
                      (this_01,(key_arg<int> *)((long)&msg_map_entry + 4));
  proto2_nofieldpresence_unittest::ForeignMessage::set_c(this_02,0x2775);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )Reflection::GetRepeatedMessage(local_f0,(Message *)&r,local_110,0);
  MapEntryKeyExplicitPresence();
  testing::Not<google::protobuf::(anonymous_namespace)::MapEntryKeyExplicitPresenceMatcher>();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::(anonymous_namespace)::MapEntryKeyExplicitPresenceMatcher>>
            ();
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::NotMatcher<google::protobuf::(anonymous_namespace)::MapEntryKeyExplicitPresenceMatcher>>
  ::operator()(local_140,&local_141,(Message *)0x1dc5ac9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_140);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x12e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
  MapEntryValueExplicitPresence();
  testing::internal::
  MakePredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryValueExplicitPresenceMatcher>
            ();
  testing::internal::
  PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryValueExplicitPresenceMatcher>
  ::operator()((PredicateFormatterFromMatcher<google::protobuf::(anonymous_namespace)::MapEntryValueExplicitPresenceMatcher>
                *)local_168,&local_169,(Message *)0x1dc5ac9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_178);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              (&local_180,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/no_field_presence_map_test.cc"
               ,0x131,pcVar2);
    testing::internal::AssertHelper::operator=(&local_180,&local_178);
    testing::internal::AssertHelper::~AssertHelper(&local_180);
    testing::Message::~Message(&local_178);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  proto2_nofieldpresence_unittest::TestAllMapTypes::~TestAllMapTypes((TestAllMapTypes *)&r);
  return;
}

Assistant:

TEST(NoFieldPresenceTest, TestNonZeroImplicitSubMessageMapEntriesHavePresence) {
  TestAllMapTypes message;
  const Reflection* r = message.GetReflection();
  const Descriptor* desc = message.GetDescriptor();

  const FieldDescriptor* field_map_int32_foreign_message =
      desc->FindFieldByName("map_int32_foreign_message");

  // Set nonzero values for key-value pairs and test that.
  (*message.mutable_map_int32_foreign_message())[123].set_c(10101);

  const google::protobuf::Message& msg_map_entry = r->GetRepeatedMessage(
      message, field_map_int32_foreign_message, /*index=*/0);

  // Fields in map entries inherit field_presence from file defaults. If a map
  // is a "no presence" field, its key is also considered "no presence" from POV
  // of the descriptor. (Even though the key itself behaves like a normal index
  // with zeroes being valid indices). One day we will change this...
  EXPECT_THAT(msg_map_entry, Not(MapEntryKeyExplicitPresence()));

  // Message types always have presence in proto3.
  EXPECT_THAT(msg_map_entry, MapEntryValueExplicitPresence());
}